

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

void __thiscall
hungarian_algorithm::HungarianSolver<double,_unsigned_long,_std::less<double>_>::
subtractSmallestUncoveredElement(HungarianSolver<double,_unsigned_long,_std::less<double>_> *this)

{
  undefined1 *this_00;
  undefined1 *this_01;
  bool bVar1;
  double dVar2;
  pointer pdVar3;
  ulong *puVar4;
  logic_error *this_02;
  size_t row;
  long lVar5;
  size_t col_1;
  size_t col;
  ulong uVar6;
  double dVar7;
  size_type __n;
  reference rVar8;
  allocator local_71;
  double local_70;
  double local_68;
  double local_60;
  vector<bool,_std::allocator<bool>_> *local_58;
  string local_50 [32];
  
  local_70 = this->zero_cost_;
  this_00 = &this->field_0x10;
  this_01 = &this->field_0x38;
  lVar5 = 0;
  bVar1 = false;
  for (dVar7 = 0.0; dVar2 = *(double *)this, (ulong)dVar7 < (ulong)dVar2;
      dVar7 = (double)((long)dVar7 + 1)) {
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)this_00,(size_type)dVar7);
    if ((*rVar8._M_p & rVar8._M_mask) == 0) {
      local_68 = dVar7;
      for (uVar6 = 0; dVar7 = local_68, uVar6 < *(ulong *)&this->field_0x8; uVar6 = uVar6 + 1) {
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)this_01,uVar6);
        dVar7 = local_70;
        if ((*rVar8._M_p & rVar8._M_mask) == 0) {
          dVar7 = *(double *)
                   ((long)(this->cost_matrix_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                   uVar6 * 8 + *(long *)&this->field_0x8 * lVar5);
          if (bVar1) {
            if (local_70 <= dVar7) {
              dVar7 = local_70;
            }
          }
          else {
            bVar1 = true;
          }
        }
        local_70 = dVar7;
      }
    }
    lVar5 = lVar5 + 8;
  }
  if (!bVar1) {
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              (local_50,"Hungarian algorithm: !found_minimum; this should never happen",&local_71);
    std::logic_error::logic_error(this_02,local_50);
    __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_58 = (vector<bool,_std::allocator<bool>_> *)&this->field_0x60;
  __n = 0;
  dVar7 = 0.0;
  do {
    if ((ulong)dVar2 <= (ulong)dVar7) {
      return;
    }
    for (uVar6 = 0; uVar6 < *(ulong *)&this->field_0x8; uVar6 = uVar6 + 1) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)this_00,(size_type)dVar7);
      if (((*rVar8._M_p & rVar8._M_mask) == 0) ||
         (rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)this_01,uVar6),
         (*rVar8._M_p & rVar8._M_mask) == 0)) {
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)this_00,(size_type)dVar7);
        if (((*rVar8._M_p & rVar8._M_mask) == 0) &&
           (rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)this_01,uVar6),
           (*rVar8._M_p & rVar8._M_mask) == 0)) {
          pdVar3 = (this->cost_matrix_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_68 = pdVar3[__n] - local_70;
          goto LAB_0011aa21;
        }
      }
      else {
        pdVar3 = (this->cost_matrix_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_68 = pdVar3[__n] + local_70;
LAB_0011aa21:
        pdVar3[__n] = local_68;
        local_60 = this->zero_cost_;
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](local_58,__n);
        puVar4 = rVar8._M_p;
        if ((local_68 != local_60) || (NAN(local_68) || NAN(local_60))) {
          *puVar4 = *puVar4 & ~rVar8._M_mask;
        }
        else {
          *puVar4 = *puVar4 | rVar8._M_mask;
        }
      }
      __n = __n + 1;
    }
    dVar7 = (double)((long)dVar7 + 1);
    dVar2 = *(double *)this;
  } while( true );
}

Assistant:

void subtractSmallestUncoveredElement()
  {
    // Find smallest uncovered element:
    bool found_minimum = false;
    Cost h = zero_cost_;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      if (!covered_rows_[row])
      {
        for (std::size_t col = 0; col < num_cols_; ++col)
        {
          if (!covered_cols_[col])
          {
            if (!found_minimum)
            {
              h = cost_matrix_[getIndex(row, col)];
              found_minimum = true;
            }
            else
            {
              h = std::min(h, cost_matrix_[getIndex(row, col)]);
            }
          }
        }
      }
    }

    if (!found_minimum)
    {
      throw std::logic_error("Hungarian algorithm: !found_minimum; this should never happen");
    }

    // Subtract h from each uncovered element, and add h to each doubly covered element:
    std::size_t i = 0;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      for (std::size_t col = 0; col < num_cols_; ++col, ++i)
      {
        if (covered_rows_[row] && covered_cols_[col])
        {
          cost_matrix_[i] += h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
        else if (!covered_rows_[row] && !covered_cols_[col])
        {
          cost_matrix_[i] -= h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
      }
    }
  }